

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::portmap_log_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_log_alert *this)

{
  undefined8 uVar1;
  char *pcVar2;
  char ret [1024];
  string local_448;
  char local_428 [1032];
  
  uVar1 = *(undefined8 *)((anonymous_namespace)::nat_type_str + (ulong)this->map_transport * 8);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_448,&(this->local_address).super_address);
  pcVar2 = log_message(this);
  snprintf(local_428,0x400,"%s [%s]: %s",uVar1,local_448._M_dataplus._M_p,pcVar2);
  ::std::__cxx11::string::~string((string *)&local_448);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_428,(allocator<char> *)&local_448);
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char ret[1024];
		std::snprintf(ret, sizeof(ret), "%s [%s]: %s"
			, nat_type_str[static_cast<int>(map_transport)]
			, local_address.to_string().c_str()
			, log_message());
		return ret;
#endif
	}